

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall p2t::Sweep::FillBasinReq(Sweep *this,SweepContext *tcx,Node *node)

{
  double *pdVar1;
  double dVar2;
  Node *pNVar3;
  Point *pPVar4;
  bool bVar5;
  Node *pNVar6;
  double dVar7;
  
LAB_00655d64:
  do {
    if (*(double *)
         (**(long **)((long)&(tcx->basin).left_node + (ulong)(((tcx->basin).left_highest ^ 1) << 4))
         + 8) - node->point->y < (tcx->basin).width) {
      return;
    }
    Fill(this,tcx,node);
    pNVar6 = node->prev;
    pNVar3 = (tcx->basin).left_node;
    if (pNVar6 == pNVar3) {
      if (node->next == (tcx->basin).right_node) {
        return;
      }
      if (pNVar6 != pNVar3) goto LAB_00655dc0;
      pNVar6 = node->next;
      pPVar4 = pNVar6->next->point;
      dVar7 = pPVar4->x;
      dVar2 = pPVar4->y;
      dVar7 = (pNVar6->point->y - dVar2) * (node->point->x - dVar7) -
              (pNVar6->point->x - dVar7) * (node->point->y - dVar2);
      bVar5 = 0.0 < dVar7;
    }
    else {
LAB_00655dc0:
      pNVar3 = node->next;
      if (pNVar3 != (tcx->basin).right_node) {
        dVar7 = pNVar3->point->y;
        pdVar1 = &pNVar6->point->y;
        node = pNVar6;
        if (dVar7 < *pdVar1 || dVar7 == *pdVar1) {
          node = pNVar3;
        }
        goto LAB_00655d64;
      }
      pPVar4 = pNVar6->prev->point;
      dVar7 = pPVar4->x;
      dVar2 = pPVar4->y;
      dVar7 = (pNVar6->point->y - dVar2) * (node->point->x - dVar7) -
              (pNVar6->point->x - dVar7) * (node->point->y - dVar2);
      bVar5 = dVar7 <= 0.0;
    }
    node = pNVar6;
    if (!(bool)(ABS(dVar7) < 1e-12 | bVar5)) {
      return;
    }
  } while( true );
}

Assistant:

void Sweep::FillBasinReq(SweepContext& tcx, Node* node)
{
  // if shallow stop filling
  if (IsShallow(tcx, *node)) {
    return;
  }

  Fill(tcx, *node);

  if (node->prev == tcx.basin.left_node && node->next == tcx.basin.right_node) {
    return;
  } else if (node->prev == tcx.basin.left_node) {
    Orientation o = Orient2d(*node->point, *node->next->point, *node->next->next->point);
    if (o == CW) {
      return;
    }
    node = node->next;
  } else if (node->next == tcx.basin.right_node) {
    Orientation o = Orient2d(*node->point, *node->prev->point, *node->prev->prev->point);
    if (o == CCW) {
      return;
    }
    node = node->prev;
  } else {
    // Continue with the neighbor node with lowest Y value
    if (node->prev->point->y < node->next->point->y) {
      node = node->prev;
    } else {
      node = node->next;
    }
  }

  FillBasinReq(tcx, node);
}